

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cfd::core::Deserializer::ReadBuffer
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Deserializer *this,uint32_t size)

{
  ulong size_00;
  allocator_type local_21;
  
  size_00 = (ulong)size;
  CheckReadSize(this,size_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,size_00,&local_21);
  memcpy((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_start,
         (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + this->offset_,size_00);
  this->offset_ = this->offset_ + size;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Deserializer::ReadBuffer(uint32_t size) {
  CheckReadSize(size);
  std::vector<uint8_t> result(size);
  memcpy(result.data(), &buffer_.data()[offset_], size);
  offset_ += size;
  return result;
}